

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_common.c
# Opt level: O3

void sylvan_init_package(void)

{
  reg_quit_entry *prVar1;
  reg_quit_entry *prVar2;
  quit_cb in_RDI;
  Task local_40;
  
  if (table_max != 0) {
    nodes = (llmsset_t)llmsset_create(table_min,table_max);
    cache_create(cache_min,cache_max);
    LOCK();
    gc = 0;
    UNLOCK();
    main_hook = sylvan_gc_aggressive_resize_CALL;
    local_40.f = sylvan_stats_init_WRAP;
    local_40.thief._M_b._M_p = (__base_type)(__pointer_type)0x1;
    lace_run_task(&local_40);
    return;
  }
  sylvan_init_package_cold_1();
  prVar2 = (reg_quit_entry *)malloc(0x10);
  prVar1 = prVar2;
  prVar2->next = quit_register;
  quit_register = prVar1;
  prVar2->cb = in_RDI;
  return;
}

Assistant:

void
sylvan_init_package(void)
{
    if (table_max == 0) {
        fprintf(stderr, "sylvan_init_package error: table sizes not set (sylvan_set_sizes or sylvan_set_limits)!");
        exit(1);
    }

    /* Create tables */
    nodes = llmsset_create(table_min, table_max);
    cache_create(cache_min, cache_max);

    /* Initialize garbage collection */
    gc = 0;
#if SYLVAN_AGGRESSIVE_RESIZE
    main_hook = TASK(sylvan_gc_aggressive_resize);
#else
    main_hook = TASK(sylvan_gc_normal_resize);
#endif

    sylvan_stats_init();
}